

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

size_t format_size(void *context,char *time,uint64_t id,size_t line,char *func,char *file,
                  char *level,char *message,metacall_log_custom_va_list args)

{
  int iVar1;
  undefined4 in_ECX;
  ulong in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  char *in_stack_00000010;
  undefined8 *in_stack_00000018;
  va_list va;
  size_t length;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  size_t local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_20;
  ulong local_18;
  undefined8 local_10;
  
  local_38 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = in_ECX;
  if (in_stack_00000018 == (undefined8 *)0x0) {
    local_38 = strlen(in_stack_00000010);
  }
  else {
    local_48 = in_stack_00000018[2];
    local_58 = *in_stack_00000018;
    uStack_50 = in_stack_00000018[1];
    iVar1 = vsnprintf((char *)0x0,0,in_stack_00000010,&local_58);
    local_38 = (size_t)iVar1;
  }
  iVar1 = snprintf((char *)0x0,0,"%.19s #%d %s:%d %s @%s ",local_10,local_18 & 0xffffffff,local_30,
                   local_20,local_28,in_stack_00000008);
  return (long)iVar1 + local_38 + 1;
}

Assistant:

static size_t format_size(void *context, const char *time, uint64_t id, size_t line, const char *func, const char *file, const char *level, const char *message, metacall_log_custom_va_list args)
{
	size_t length = 0;

	(void)context;

	if (args != NULL)
	{
		va_list va;

		va_copy(va, args->va);

		length = vsnprintf(NULL, 0, message, va);

		va_end(va);
	}
	else
	{
		length = strlen(message);
	}

	return snprintf(NULL, 0, format, time, (int)id, file, (int)line, func, level) + length + 1;
}